

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Distribution.cpp
# Opt level: O1

float __thiscall NormalDistribution::getRandomNumber(NormalDistribution *this)

{
  mt19937 *__urng;
  float fVar1;
  double dVar2;
  bool bVar3;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_double>
  __aurng;
  uint uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  __urng = &(this->super_Distribution).gen;
  bVar3 = false;
  do {
    dVar5 = std::
            generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                      (__urng);
    dVar7 = (this->super_Distribution).distrib._M_param._M_a;
    dVar8 = (this->super_Distribution).distrib._M_param._M_b;
    dVar6 = std::
            generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                      (__urng);
    dVar9 = (this->super_Distribution).distrib._M_param._M_a;
    dVar2 = (this->super_Distribution).distrib._M_param._M_b;
    dVar7 = (double)(float)((dVar8 - dVar7) * dVar5 + dVar7);
    dVar8 = log(dVar7);
    dVar8 = exp((-1.0 - dVar8) * (-1.0 - dVar8) * -0.5);
    if ((double)(float)((dVar2 - dVar9) * dVar6 + dVar9) <= dVar8) {
      bVar3 = true;
    }
  } while (!bVar3);
  dVar9 = std::
          generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                    (__urng);
  dVar8 = (this->super_Distribution).distrib._M_param._M_a;
  fVar1 = this->sigma;
  uVar4 = -(uint)((float)(((this->super_Distribution).distrib._M_param._M_b - dVar8) * dVar9 + dVar8
                         ) < 0.5);
  dVar7 = log(dVar7);
  return (float)(dVar7 * (double)(float)(~uVar4 & (uint)-fVar1 | (uint)fVar1 & uVar4) +
                (double)this->mu);
}

Assistant:

float NormalDistribution::getRandomNumber() {
	float u1;
	float u2;
	float u3;
	bool accepted = false;

	while(!accepted){
		u1 = this->distrib(gen);
		u2 = this->distrib(gen);
		if (u2 <= exp(-0.5*pow(-log(u1)-1,2))){
			accepted = true;
		}
	}

	u3 = this->distrib(gen);
	if (u3 < 0.5) return sigma*log(u1)+mu;
	else return -sigma*log(u1)+mu;
}